

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

StructSet * __thiscall
wasm::Builder::makeStructSet
          (Builder *this,Index index,Expression *ref,Expression *value,MemoryOrder order)

{
  StructSet *pSVar1;
  
  pSVar1 = MixedArena::alloc<wasm::StructSet>(&this->wasm->allocator);
  pSVar1->index = index;
  pSVar1->ref = ref;
  pSVar1->value = value;
  pSVar1->order = order;
  wasm::StructSet::finalize();
  return pSVar1;
}

Assistant:

StructSet* makeStructSet(Index index,
                           Expression* ref,
                           Expression* value,
                           MemoryOrder order) {
    auto* ret = wasm.allocator.alloc<StructSet>();
    ret->index = index;
    ret->ref = ref;
    ret->value = value;
    ret->order = order;
    ret->finalize();
    return ret;
  }